

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::DecodeAddress
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  pointer __src;
  ByteData *data;
  AddressFormatData *this_00;
  uint8_t uVar1;
  AddressType AVar2;
  bool bVar3;
  uint8_t uVar4;
  WitnessVersion WVar5;
  NetType_conflict NVar6;
  int iVar7;
  CfdException *pCVar8;
  string *bech32_hrp;
  string *bech32_hrp_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var10;
  Address *pAVar11;
  int ret;
  Address *local_128;
  size_t written;
  allocator local_111;
  Script script;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_part;
  string local_b8;
  NetType_conflict local_94;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_90;
  CfdSourceLocation local_88;
  string segwit_prefix;
  string bs58;
  
  local_128 = this;
  local_90 = network_parameters;
  if ((DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
       ::kBech32Separator_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                   ::kBech32Separator_abi_cxx11_), iVar7 != 0)) {
    ::std::__cxx11::string::string
              ((string *)
               &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                ::kBech32Separator_abi_cxx11_,"1",(allocator *)&script);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                  ::kBech32Separator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                         ::kBech32Separator_abi_cxx11_);
  }
  ::std::__cxx11::string::string((string *)&bs58,(string *)address_string);
  ::std::__cxx11::string::string((string *)&segwit_prefix,"",(allocator *)&script);
  p_Var9 = DAT_00680b60;
  ret = -1;
  if (local_90 ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    for (p_Var10 = kBitcoinAddressFormatList; p_Var10 != p_Var9; p_Var10 = p_Var10 + 1) {
      AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&script,(AddressFormatData *)p_Var10);
      bVar3 = DecodeAddress::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&bs58,(string *)&script,bech32_hrp_00);
      ::std::__cxx11::string::~string((string *)&script);
      if (bVar3) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&script,(AddressFormatData *)p_Var10);
        ::std::__cxx11::string::operator=((string *)&segwit_prefix,(string *)&script);
        ::std::__cxx11::string::~string((string *)&script);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_128->format_data_,p_Var10);
        break;
      }
    }
  }
  else {
    p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_90->
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var9 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_90->
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     )._M_impl.super__Vector_impl_data._M_start; p_Var9 != p_Var10;
        p_Var9 = p_Var9 + 1) {
      AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&script,(AddressFormatData *)p_Var9);
      if (CONCAT44(script.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_,
                   script.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._0_4_) == 0) {
LAB_002d22c4:
        ::std::__cxx11::string::~string((string *)&script);
      }
      else {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_b8,(AddressFormatData *)p_Var9);
        if (bs58._M_string_length <= local_b8._M_string_length) {
          ::std::__cxx11::string::~string((string *)&local_b8);
          goto LAB_002d22c4;
        }
        AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&data_part,(AddressFormatData *)p_Var9)
        ;
        bVar3 = DecodeAddress::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&bs58,(string *)&data_part,bech32_hrp);
        ::std::__cxx11::string::~string((string *)&data_part);
        ::std::__cxx11::string::~string((string *)&local_b8);
        ::std::__cxx11::string::~string((string *)&script);
        if (bVar3) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&script,(AddressFormatData *)p_Var9);
          ::std::__cxx11::string::operator=((string *)&segwit_prefix,(string *)&script);
          ::std::__cxx11::string::~string((string *)&script);
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_128->format_data_,p_Var9);
          break;
        }
      }
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_part,0x80,
             (allocator_type *)&script);
  written = 0;
  if (segwit_prefix._M_string_length == 0) {
    ret = wally_base58_to_bytes
                    (bs58._M_dataplus._M_p,1,
                     data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)data_part.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)data_part.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,&written);
    if (ret != 0) {
      script._vptr_Script = (_func_int **)0x4f167b;
      script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 1099;
      script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "DecodeAddress";
      logger::warn<int&>((CfdSourceLocation *)&script,"wally_base58_to_bytes error. ret={}.",&ret);
      iVar7 = ret;
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      if (iVar7 != -2) {
        ::std::__cxx11::string::string
                  ((string *)&script,"Base58 decode error.",(allocator *)&local_b8);
        CfdException::CfdException(pCVar8,kCfdInternalError,(string *)&script);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::string
                ((string *)&script,"Base58 decode error.",(allocator *)&local_b8);
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_part,written);
    p_Var9 = DAT_00680b60;
    p_Var10 = kBitcoinAddressFormatList;
    if (local_90 ==
        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0)
    {
      for (; p_Var10 != p_Var9; p_Var10 = p_Var10 + 1) {
        uVar1 = *data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar4 = AddressFormatData::GetP2shPrefix((AddressFormatData *)p_Var10);
        if (uVar1 == uVar4) {
          if (1 < local_128->addr_type_ - kP2shP2wshAddress) {
            local_128->addr_type_ = kP2shAddress;
          }
LAB_002d260a:
          pAVar11 = local_128;
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_128->format_data_,p_Var10);
          goto LAB_002d2619;
        }
        uVar1 = *data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar4 = AddressFormatData::GetP2pkhPrefix((AddressFormatData *)p_Var10);
        if (uVar1 == uVar4) {
          local_128->addr_type_ = kP2pkhAddress;
          goto LAB_002d260a;
        }
      }
    }
    else {
      p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_90->
                   super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var9 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_90->
                       super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       )._M_impl.super__Vector_impl_data._M_start; p_Var9 != p_Var10;
          p_Var9 = p_Var9 + 1) {
        uVar1 = *data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar4 = AddressFormatData::GetP2shPrefix((AddressFormatData *)p_Var9);
        if (uVar1 == uVar4) {
          if (1 < local_128->addr_type_ - kP2shP2wshAddress) {
            local_128->addr_type_ = kP2shAddress;
          }
LAB_002d25a9:
          pAVar11 = local_128;
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_128->format_data_,p_Var9);
LAB_002d2619:
          pAVar11->witness_ver_ = kVersionNone;
          __src = data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
          if (__src != data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish) {
            memmove(data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,__src,
                    (long)data_part.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)__src);
          }
          data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          goto LAB_002d2646;
        }
        uVar1 = *data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar4 = AddressFormatData::GetP2pkhPrefix((AddressFormatData *)p_Var9);
        if (uVar1 == uVar4) {
          local_128->addr_type_ = kP2pkhAddress;
          goto LAB_002d25a9;
        }
      }
    }
    script._vptr_Script = (_func_int **)0x4f167b;
    script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x474;
    script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "DecodeAddress";
    logger::warn<>((CfdSourceLocation *)&script,"Unknown address prefix.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&script,"Unknown address prefix.",(allocator *)&local_b8);
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = wally_addr_segwit_to_bytes
                  (bs58._M_dataplus._M_p,segwit_prefix._M_dataplus._M_p,0,
                   data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,&written);
  if (ret != 0) {
    script._vptr_Script = (_func_int **)0x4f167b;
    script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x425;
    script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "DecodeAddress";
    logger::warn<int&>((CfdSourceLocation *)&script,"wally_addr_segwit_to_bytes error. ret={}.",&ret
                      );
    iVar7 = ret;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    if (iVar7 != -2) {
      ::std::__cxx11::string::string
                ((string *)&script,"Segwit-address decode error.",(allocator *)&local_b8);
      CfdException::CfdException(pCVar8,kCfdInternalError,(string *)&script);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::string
              ((string *)&script,"Segwit-address decode error.",(allocator *)&local_b8);
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_part,written);
  ByteData::ByteData((ByteData *)&local_b8,
                     data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(uint32_t)written);
  Script::Script(&script,(ByteData *)&local_b8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  bVar3 = Script::IsWitnessProgram(&script);
  if (!bVar3) {
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_b8,"address decode check error.",(allocator *)&local_88);
    CfdException::CfdException(pCVar8,kCfdInternalError,&local_b8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar5 = Script::GetWitnessVersion(&script);
  local_128->witness_ver_ = WVar5;
  if (WVar5 == kVersion0) {
    if (written == 0x16) {
      AVar2 = kP2wpkhAddress;
    }
    else {
      if (written != 0x22) goto LAB_002d25e0;
      AVar2 = kP2wshAddress;
    }
  }
  else {
    if (WVar5 != kVersion1) goto LAB_002d25e0;
    if (written != 0x22) {
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_b8,"segwit v1 address decode check error.",(allocator *)&local_88)
      ;
      CfdException::CfdException(pCVar8,kCfdInternalError,&local_b8);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    AVar2 = kTaprootAddress;
  }
  local_128->addr_type_ = AVar2;
LAB_002d25e0:
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            (&data_part,
             (const_iterator)
             data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (const_iterator)
             (data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 2));
  Script::~Script(&script);
LAB_002d2646:
  ByteData::ByteData((ByteData *)&script,&data_part);
  pAVar11 = local_128;
  data = &local_128->hash_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data,&script);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
  if (pAVar11->witness_ver_ == kVersion1) {
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&script,data);
    pAVar11 = local_128;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128->schnorr_pubkey_,
               &script);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
  }
  this_00 = &pAVar11->format_data_;
  NVar6 = AddressFormatData::GetNetType(this_00);
  local_128->type_ = NVar6;
  local_88.filename = "cfdcore_address.cpp";
  local_88.line = 0x482;
  local_88.funcname = "DecodeAddress";
  local_94 = AddressFormatData::GetNetType(this_00);
  ::std::__cxx11::string::string((string *)&local_b8,"nettype",&local_111);
  AddressFormatData::GetString((string *)&script,this_00,&local_b8);
  logger::info<cfd::core::NetType,std::__cxx11::string>
            (&local_88,"DecodeAddress nettype={},{}",&local_94,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script);
  ::std::__cxx11::string::~string((string *)&script);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::__cxx11::string::~string((string *)&segwit_prefix);
  ::std::__cxx11::string::~string((string *)&bs58);
  return;
}

Assistant:

void Address::DecodeAddress(
    std::string address_string,
    const std::vector<AddressFormatData>* network_parameters) {
  static const std::string kBech32Separator = "1";
  static const auto StartsWith = [](const std::string& message,
                                    const std::string& bech32_hrp) -> bool {
    return (message.find(bech32_hrp + kBech32Separator) == 0);
  };

  std::string bs58 = address_string;
  std::string segwit_prefix = "";
  int ret = -1;

  if (network_parameters != nullptr) {
    for (const AddressFormatData& param : *network_parameters) {
      // Custom parameter
      if ((!param.GetBech32Hrp().empty()) &&
          (param.GetBech32Hrp().length() < bs58.length()) &&
          (StartsWith(bs58, param.GetBech32Hrp()))) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  } else {
    for (const auto& param : kBitcoinAddressFormatList) {
      if (StartsWith(bs58, param.GetBech32Hrp())) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  }

  std::vector<uint8_t> data_part(128);
  size_t written = 0;

  if (!segwit_prefix.empty()) {
    // Bech32 Address
    ret = wally_addr_segwit_to_bytes(
        bs58.data(), segwit_prefix.data(), 0, data_part.data(),
        data_part.size(), &written);

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_addr_segwit_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(
            kCfdIllegalArgumentError, "Segwit-address decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Segwit-address decode error.");
      }
    }

    data_part.resize(written);
    Script script(ByteData(data_part.data(), static_cast<uint32_t>(written)));
    if (!script.IsWitnessProgram()) {
      throw CfdException(kCfdInternalError, "address decode check error.");
    }
    witness_ver_ = script.GetWitnessVersion();

    if (witness_ver_ == kVersion1) {
      if (written != (SchnorrPubkey::kSchnorrPubkeySize + 2)) {
        throw CfdException(
            kCfdInternalError, "segwit v1 address decode check error.");
      }
      SetAddressType(kTaprootAddress);
    } else if (witness_ver_ == kVersion0) {
      if (written == kScriptHashP2wpkhLength) {
        SetAddressType(kP2wpkhAddress);
      } else if (written == kScriptHashP2wshLength) {
        SetAddressType(kP2wshAddress);
      }
    }

    // Delete 0byte:WitnessVersion and 1byte:data_part
    data_part.erase(data_part.begin(), data_part.begin() + 2);

  } else {
    ret = wally_base58_to_bytes(
        bs58.data(), BASE58_FLAG_CHECKSUM, data_part.data(), data_part.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(kCfdIllegalArgumentError, "Base58 decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Base58 decode error.");
      }
    }

    data_part.resize(written);

    bool find_address_type = false;
    if (network_parameters != nullptr) {
      for (const AddressFormatData& param : *network_parameters) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    } else {
      for (const auto& param : kBitcoinAddressFormatList) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    }
    if (!find_address_type) {
      warn(CFD_LOG_SOURCE, "Unknown address prefix.");
      throw CfdException(kCfdIllegalArgumentError, "Unknown address prefix.");
    }
    witness_ver_ = kVersionNone;

    // Delete 0byte:prefix.
    data_part.erase(data_part.begin());
  }

  // Setting for Hash.
  hash_ = ByteData(data_part);
  if (witness_ver_ == kVersion1) schnorr_pubkey_ = SchnorrPubkey(hash_);
  SetNetType(format_data_);
  info(
      CFD_LOG_SOURCE, "DecodeAddress nettype={},{}", format_data_.GetNetType(),
      format_data_.GetString(kNettype));
}